

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertCountingUnits<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  precise_unit *in_RSI;
  precise_unit *in_RDI;
  double in_XMM0_Qa;
  double dVar9;
  double dVar10;
  int muxIndex_1;
  int muxIndex;
  int mol_result;
  int mol_start;
  int count_result;
  int count_start;
  int rad_result;
  int rad_start;
  unit_data base_result;
  unit_data base_start;
  size_type in_stack_ffffffffffffff88;
  array<double,_5UL> *in_stack_ffffffffffffff90;
  unit_data local_28;
  unit_data local_24;
  precise_unit *local_20;
  precise_unit *local_18;
  double local_10;
  double local_8;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  local_24 = precise_unit::base_units(in_RDI);
  local_28 = precise_unit::base_units(local_20);
  iVar1 = unit_data::radian(&local_24);
  iVar2 = unit_data::radian(&local_28);
  iVar3 = unit_data::count(&local_24);
  iVar4 = unit_data::count(&local_28);
  iVar5 = unit_data::mole(&local_24);
  iVar6 = unit_data::mole(&local_28);
  if (((iVar5 == iVar6) && (iVar1 == iVar2)) && ((iVar3 == 0 || (iVar4 == 0)))) {
    dVar9 = precise_unit::multiplier(local_18);
    local_8 = precise_unit::multiplier(local_20);
    local_8 = (local_10 * dVar9) / local_8;
  }
  else if ((iVar5 == iVar6) &&
          (((iVar1 == 0 && ((iVar3 == iVar2 || (iVar3 == 0)))) ||
           ((iVar2 == 0 && ((iVar4 == iVar1 || (iVar4 == 0)))))))) {
    iVar1 = (iVar2 - iVar1) + 2;
    if ((iVar1 < 0) || (4 < iVar1)) {
      local_8 = NAN;
    }
    else {
      pvVar7 = std::array<double,_5UL>::operator[]
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      dVar9 = *pvVar7 * local_10;
      local_10 = dVar9;
      dVar10 = precise_unit::multiplier(local_18);
      local_8 = precise_unit::multiplier(local_20);
      local_8 = (dVar9 * dVar10) / local_8;
    }
  }
  else if ((iVar1 == iVar2) &&
          (((iVar5 == 0 && ((iVar3 == iVar6 || (iVar3 == 0)))) ||
           ((iVar6 == 0 && ((iVar4 == iVar5 || (iVar4 == 0)))))))) {
    iVar1 = (iVar6 - iVar5) + 1;
    if ((iVar1 < 0) || (2 < iVar1)) {
      local_8 = NAN;
    }
    else {
      pvVar8 = std::array<double,_3UL>::operator[]
                         ((array<double,_3UL> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
      ;
      dVar10 = *pvVar8 * local_10;
      local_10 = dVar10;
      dVar9 = precise_unit::multiplier(local_18);
      dVar10 = dVar10 * dVar9;
      local_8 = precise_unit::multiplier(local_20);
      local_8 = dVar10 / local_8;
    }
  }
  else {
    local_8 = NAN;
  }
  return local_8;
}

Assistant:

inline double
        convertCountingUnits(double val, const UX& start, const UX2& result)
    {
        auto base_start = start.base_units();
        auto base_result = result.base_units();

        auto rad_start = base_start.radian();
        auto rad_result = base_result.radian();
        auto count_start = base_start.count();
        auto count_result = base_result.count();
        auto mol_start = base_start.mole();
        auto mol_result = base_result.mole();
        if (mol_start == mol_result && rad_start == rad_result &&
            (count_start == 0 || count_result == 0)) {
            val = val * start.multiplier() / result.multiplier();
            return val;
        }

        if (mol_start == mol_result &&
            ((rad_start == 0 &&
              (count_start == rad_result || count_start == 0)) ||
             (rad_result == 0 &&
              (count_result == rad_start || count_result == 0)))) {
            // define a conversion multiplier for radians<->count(rotations) of
            // various powers
            static constexpr std::array<double, 5> muxrad{
                {1.0 / (4.0 * constants::pi * constants::pi),
                 1.0 / (2.0 * constants::pi),
                 0.0,
                 2.0 * constants::pi,
                 4.0 * constants::pi * constants::pi}};
            int muxIndex =
                rad_result - rad_start + 2;  // +2 is to shift the index
            if (muxIndex < 0 || muxIndex > 4) {
                return constants::invalid_conversion;
            }
            val *= muxrad[muxIndex];
            // either 1 or the other is 0 in this equation other it would have
            // triggered before or not gotten here
            val = val * start.multiplier() / result.multiplier();
            return val;
        }
        if (rad_start == rad_result &&
            ((mol_start == 0 &&
              (count_start == mol_result || count_start == 0)) ||
             (mol_result == 0 &&
              (count_result == mol_start || count_result == 0)))) {
            // define multipliers for mol<->count conversions based on powers
            static constexpr std::array<double, 3> muxmol{
                {6.02214076e23, 0, 1.0 / 6.02214076e23}};

            const int muxIndex =
                mol_result - mol_start + 1;  // +1 is to shift the index
            if (muxIndex < 0 || muxIndex > 2) {
                return constants::invalid_conversion;
            }
            val *= muxmol[muxIndex];
            // either 1 or the other is 0 in this equation other it would have
            // triggered before or not gotten here
            val = val * start.multiplier() / result.multiplier();
            return val;
        }
        return constants::invalid_conversion;
    }